

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O0

void __thiscall Analysis::FlowAnalysis_multistrange_particles(Analysis *this)

{
  bool bVar1;
  void *pvVar2;
  pretty_ostream *this_00;
  string *in_RDI;
  singleParticleSpectra **ipart_1;
  iterator __end1;
  iterator __begin1;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *__range1;
  int particle_monval;
  singleParticleSpectra **ipart;
  iterator __end2;
  iterator __begin2;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *__range2;
  int nev;
  int event_id;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> spvn;
  ParameterReader paraRdr;
  shared_ptr<RandomUtil::Random> *in_stack_000008a8;
  string *in_stack_000008b0;
  ParameterReader *in_stack_000008b8;
  singleParticleSpectra *in_stack_000008c0;
  particleSamples *in_stack_fffffffffffff8e8;
  singleParticleSpectra *in_stack_fffffffffffff8f0;
  ParameterReader *in_stack_fffffffffffff8f8;
  ParameterReader *in_stack_fffffffffffff900;
  string *psVar3;
  string *type;
  allocator *this_01;
  double in_stack_fffffffffffffa20;
  allocator *value;
  string *in_stack_fffffffffffffa28;
  ParameterReader *in_stack_fffffffffffffa30;
  ParameterReader *this_02;
  __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
  local_590;
  undefined1 *local_588;
  undefined1 local_579 [33];
  ParameterReader local_558;
  undefined1 *local_528;
  allocator local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [32];
  int local_4d0;
  undefined1 local_4c9 [37];
  int local_4a4;
  int local_4a0;
  undefined1 local_499;
  string local_488 [32];
  void *local_468;
  allocator local_459;
  string local_458 [39];
  undefined1 local_431;
  string local_420 [32];
  void *local_400;
  allocator local_3f1;
  string local_3f0 [39];
  undefined1 local_3c9;
  string local_3b8 [32];
  void *local_398;
  allocator local_389;
  string local_388 [39];
  undefined1 local_361;
  string local_350 [32];
  void *local_330;
  allocator local_321;
  string local_320 [39];
  undefined1 local_2f9;
  string local_2e8 [32];
  void *local_2c8;
  allocator local_2b9;
  string local_2b8 [39];
  undefined1 local_291;
  string local_280 [32];
  void *local_260;
  allocator local_251;
  string local_250 [39];
  undefined1 local_229;
  string local_218 [32];
  void *local_1f8;
  undefined1 local_1e9 [33];
  undefined1 local_1c8 [31];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [32];
  shared_ptr<particleSamples> *in_stack_fffffffffffffea0;
  singleParticleSpectra *in_stack_fffffffffffffea8;
  undefined1 local_131 [40];
  undefined1 local_109 [40];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [88];
  
  ParameterReader::ParameterReader(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"compute_correlation",&local_59);
  ParameterReader::setVal
            (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"flag_charge_dependence",&local_91);
  ParameterReader::setVal
            (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"rap_type",&local_b9);
  ParameterReader::setVal
            (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"rapidity_distribution",&local_e1);
  ParameterReader::setVal
            (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  this_02 = (ParameterReader *)local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_109 + 1),"rapidityPTDistributionFlag",(allocator *)this_02);
  ParameterReader::setVal(this_02,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  std::__cxx11::string::~string((string *)(local_109 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_109);
  psVar3 = (string *)local_131;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_131 + 1),"rap_min",(allocator *)psVar3);
  ParameterReader::setVal(this_02,psVar3,in_stack_fffffffffffffa20);
  std::__cxx11::string::~string((string *)(local_131 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_131);
  value = (allocator *)&stack0xfffffffffffffea7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffea8,"rap_max",value);
  ParameterReader::setVal(this_02,psVar3,(double)value);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffea7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"vn_rapidity_dis_pT_min",&local_181);
  ParameterReader::setVal(this_02,psVar3,(double)value);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  this_01 = &local_1a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"vn_rapidity_dis_pT_max",this_01);
  ParameterReader::setVal(this_02,psVar3,(double)value);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::vector
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)0x1ab6ca);
  type = (string *)local_1e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1e9 + 1),"particle_monval",(allocator *)type);
  ParameterReader::setVal(this_02,psVar3,(double)value);
  std::__cxx11::string::~string((string *)(local_1e9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1e9);
  pvVar2 = operator_new(0x8b8);
  local_229 = 1;
  std::__cxx11::string::string(local_218,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff8f0,
             (shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff8e8);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_000008c0,in_stack_000008b8,in_stack_000008b0,in_stack_000008a8);
  local_229 = 0;
  local_1f8 = pvVar2;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff8f0,(value_type *)in_stack_fffffffffffff8e8);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1ab7ed);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"particle_monval",&local_251);
  ParameterReader::setVal(this_02,psVar3,(double)value);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  pvVar2 = operator_new(0x8b8);
  local_291 = 1;
  std::__cxx11::string::string(local_280,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff8f0,
             (shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff8e8);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_000008c0,in_stack_000008b8,in_stack_000008b0,in_stack_000008a8);
  local_291 = 0;
  local_260 = pvVar2;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff8f0,(value_type *)in_stack_fffffffffffff8e8);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1ab91d);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"particle_monval",&local_2b9);
  ParameterReader::setVal(this_02,psVar3,(double)value);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  pvVar2 = operator_new(0x8b8);
  local_2f9 = 1;
  std::__cxx11::string::string(local_2e8,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff8f0,
             (shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff8e8);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_000008c0,in_stack_000008b8,in_stack_000008b0,in_stack_000008a8);
  local_2f9 = 0;
  local_2c8 = pvVar2;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff8f0,(value_type *)in_stack_fffffffffffff8e8);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1aba4d);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"particle_monval",&local_321);
  ParameterReader::setVal(this_02,psVar3,(double)value);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  pvVar2 = operator_new(0x8b8);
  local_361 = 1;
  std::__cxx11::string::string(local_350,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff8f0,
             (shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff8e8);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_000008c0,in_stack_000008b8,in_stack_000008b0,in_stack_000008a8);
  local_361 = 0;
  local_330 = pvVar2;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff8f0,(value_type *)in_stack_fffffffffffff8e8);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1abb7d);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"particle_monval",&local_389);
  ParameterReader::setVal(this_02,psVar3,(double)value);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  pvVar2 = operator_new(0x8b8);
  local_3c9 = 1;
  std::__cxx11::string::string(local_3b8,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff8f0,
             (shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff8e8);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_000008c0,in_stack_000008b8,in_stack_000008b0,in_stack_000008a8);
  local_3c9 = 0;
  local_398 = pvVar2;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff8f0,(value_type *)in_stack_fffffffffffff8e8);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1abcad);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f0,"particle_monval",&local_3f1);
  ParameterReader::setVal(this_02,psVar3,(double)value);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  pvVar2 = operator_new(0x8b8);
  local_431 = 1;
  std::__cxx11::string::string(local_420,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff8f0,
             (shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff8e8);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_000008c0,in_stack_000008b8,in_stack_000008b0,in_stack_000008a8);
  local_431 = 0;
  local_400 = pvVar2;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff8f0,(value_type *)in_stack_fffffffffffff8e8);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1abddd);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"particle_monval",&local_459);
  ParameterReader::setVal(this_02,psVar3,(double)value);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  pvVar2 = operator_new(0x8b8);
  local_499 = 1;
  std::__cxx11::string::string(local_488,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff8f0,
             (shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff8e8);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_000008c0,in_stack_000008b8,in_stack_000008b0,in_stack_000008a8);
  local_499 = 0;
  local_468 = pvVar2;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff8f0,(value_type *)in_stack_fffffffffffff8e8);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1abf0d);
  std::__cxx11::string::~string(local_488);
  local_4a0 = 0;
  while( true ) {
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1abf36);
    bVar1 = particleSamples::end_of_file(in_stack_fffffffffffff8e8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pretty_ostream::operator<<
              ((pretty_ostream *)in_stack_fffffffffffff8f0,(char (*) [16])in_stack_fffffffffffff8e8)
    ;
    local_4a4 = local_4a0 + 1;
    this_00 = pretty_ostream::operator<<
                        ((pretty_ostream *)in_stack_fffffffffffff8f0,
                         (int *)in_stack_fffffffffffff8e8);
    pretty_ostream::operator<<
              ((pretty_ostream *)in_stack_fffffffffffff8f0,(char (*) [6])in_stack_fffffffffffff8e8);
    psVar3 = (string *)local_4c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_4c9 + 1),"info",(allocator *)psVar3);
    pretty_ostream::flush((pretty_ostream *)this_01,type);
    std::__cxx11::string::~string((string *)(local_4c9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_4c9);
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1ac02b);
    local_4d0 = particleSamples::read_in_particle_samples
                          ((particleSamples *)in_stack_fffffffffffff8f0);
    pretty_ostream::operator<<
              ((pretty_ostream *)in_stack_fffffffffffff8f0,(char (*) [7])in_stack_fffffffffffff8e8);
    pretty_ostream::operator<<
              ((pretty_ostream *)in_stack_fffffffffffff8f0,(int *)in_stack_fffffffffffff8e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4f0,"info",&local_4f1);
    pretty_ostream::flush((pretty_ostream *)this_01,type);
    std::__cxx11::string::~string(local_4f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_518," processing ...",&local_519);
    pretty_ostream::info(this_00,psVar3);
    std::__cxx11::string::~string(local_518);
    std::allocator<char>::~allocator((allocator<char> *)&local_519);
    local_528 = local_1c8;
    local_558.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::
                  begin((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *
                        )in_stack_fffffffffffff8e8);
    local_558.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::
                  end((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
                      in_stack_fffffffffffff8e8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                          *)in_stack_fffffffffffff8f0,
                         (__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                          *)in_stack_fffffffffffff8e8);
      if (!bVar1) break;
      local_558.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)__gnu_cxx::
                    __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                    ::operator*((__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                                 *)&local_558.values.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
      local_558.names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           singleParticleSpectra::get_monval
                     ((singleParticleSpectra *)
                      *local_558.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1ac1ee);
      particleSamples::filter_particles_from_events
                ((particleSamples *)in_stack_fffffffffffff8f0,
                 (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
      in_stack_fffffffffffff900 = &local_558;
      std::shared_ptr<particleSamples>::shared_ptr
                ((shared_ptr<particleSamples> *)in_stack_fffffffffffff8f0,
                 (shared_ptr<particleSamples> *)in_stack_fffffffffffff8e8);
      singleParticleSpectra::calculate_Qn_vector_shell
                (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      std::shared_ptr<particleSamples>::~shared_ptr((shared_ptr<particleSamples> *)0x1ac24b);
      __gnu_cxx::
      __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
      ::operator++((__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                    *)&local_558.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    }
    in_stack_fffffffffffff8e8 = (particleSamples *)(in_RDI + 0x70);
    in_stack_fffffffffffff8f0 = (singleParticleSpectra *)local_579;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_579 + 1),"done!",(allocator *)in_stack_fffffffffffff8f0);
    pretty_ostream::info(this_00,psVar3);
    std::__cxx11::string::~string((string *)(local_579 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_579);
    local_4a0 = local_4d0 + local_4a0;
  }
  local_588 = local_1c8;
  local_590._M_current =
       (singleParticleSpectra **)
       std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::begin
                 ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
                  in_stack_fffffffffffff8e8);
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::end
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff8e8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                        *)in_stack_fffffffffffff8f0,
                       (__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                        *)in_stack_fffffffffffff8e8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
    ::operator*(&local_590);
    singleParticleSpectra::output_spectra_and_Qn_results(in_stack_fffffffffffff8f0);
    __gnu_cxx::
    __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
    ::operator++(&local_590);
  }
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::clear
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)0x1acc1c);
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::~vector
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff900);
  ParameterReader::~ParameterReader((ParameterReader *)in_stack_fffffffffffff8f0);
  return;
}

Assistant:

void Analysis::FlowAnalysis_multistrange_particles() {
    ParameterReader paraRdr = paraRdr_;
    paraRdr.setVal("compute_correlation", 0);
    paraRdr.setVal("flag_charge_dependence", 0);
    paraRdr.setVal("rap_type", 1);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("rapidityPTDistributionFlag", 0);
    paraRdr.setVal("rap_min", -0.5);
    paraRdr.setVal("rap_max", 0.5);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);

    // first define all the analysis sets
    std::vector<singleParticleSpectra *> spvn;
    paraRdr.setVal("particle_monval", 3122);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -3122);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 3312);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -3312);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 3334);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -3334);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 333);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // start the loop
    int event_id = 0;
    while (!particle_list_->end_of_file()) {
        messager << "Reading event: " << event_id + 1 << " ... ";
        messager.flush("info");
        int nev = particle_list_->read_in_particle_samples();
        messager << "nev = " << nev;
        messager.flush("info");
        messager.info(" processing ...");
        for (auto &ipart : spvn) {
            int particle_monval = ipart->get_monval();
            particle_list_->filter_particles_from_events(particle_monval);
            ipart->calculate_Qn_vector_shell(particle_list_);
        }
        messager.info("done!");
        event_id += nev;
    }
    for (auto &ipart : spvn) ipart->output_spectra_and_Qn_results();
    spvn.clear();
}